

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkGetBddNodeNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int i;
  int iVar3;
  
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    iVar3 = 0;
    i = 0;
    do {
      if (pNtk->vObjs->nSize <= i) {
        return iVar3;
      }
      pAVar2 = Abc_NtkObj(pNtk,i);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        if ((DdNode *)(pAVar2->field_5).pData == (DdNode *)0x0) {
          __assert_fail("pNode->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                        ,0xff,"int Abc_NtkGetBddNodeNum(Abc_Ntk_t *)");
        }
        if (1 < (pAVar2->vFanins).nSize) {
          iVar1 = Cudd_DagSize((DdNode *)(pAVar2->field_5).pData);
          iVar3 = iVar3 + iVar1 + -1;
        }
      }
      i = i + 1;
    } while( true );
  }
  __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xfc,"int Abc_NtkGetBddNodeNum(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkGetBddNodeNum( Abc_Ntk_t * pNtk )
{
    int nNodes = 0;
#ifdef ABC_USE_CUDD
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsBddLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        if ( Abc_ObjFaninNum(pNode) < 2 )
            continue;
        nNodes += pNode->pData? -1 + Cudd_DagSize( (DdNode *)pNode->pData ) : 0;
    }
#endif
    return nNodes;
}